

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuResource.cpp
# Opt level: O0

void __thiscall tcu::DirArchive::~DirArchive(DirArchive *this)

{
  DirArchive *this_local;
  
  ~DirArchive(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

DirArchive::~DirArchive ()
{
}